

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_reset_matchState
                 (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_compressionParameters *cParams,
                 ZSTD_useRowMatchFinderMode_e useRowMatchFinder,ZSTD_compResetPolicy_e crp,
                 ZSTD_indexResetPolicy_e forceResetIndex,ZSTD_resetTarget_e forWho)

{
  uint uVar1;
  bool bVar2;
  ZSTD_strategy ZVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  U32 *pUVar9;
  uint *puVar10;
  ZSTD_match_t *pZVar11;
  ZSTD_optimal_t *pZVar12;
  ulong uVar13;
  byte bVar14;
  U32 UVar15;
  size_t __n;
  long lVar16;
  U16 *__s;
  void *pvVar17;
  void *pvVar18;
  
  if (((forWho == ZSTD_resetTarget_CDict) && (ms->dedicatedDictSearch != 0)) ||
     ((cParams->strategy != ZSTD_fast &&
      (useRowMatchFinder != ZSTD_urm_enableRowMatchFinder || 2 < cParams->strategy - ZSTD_greedy))))
  {
    lVar16 = 4L << ((byte)cParams->chainLog & 0x3f);
  }
  else {
    lVar16 = 0;
  }
  uVar1 = cParams->hashLog;
  uVar8 = 0;
  if ((forWho == ZSTD_resetTarget_CCtx) && (uVar8 = 0, cParams->minMatch == 3)) {
    uVar8 = 0x11;
    if (cParams->windowLog < 0x11) {
      uVar8 = cParams->windowLog;
    }
  }
  if (forceResetIndex == ZSTDirp_reset) {
    (ms->window).nextSrc = (BYTE *)0x0;
    (ms->window).base = (BYTE *)0x0;
    (ms->window).dictBase = (BYTE *)0x0;
    (ms->window).dictLimit = 0;
    (ms->window).lowLimit = 0;
    *(undefined8 *)&(ms->window).nbOverflowCorrections = 0;
    (ms->window).base = "";
    (ms->window).dictBase = "";
    (ms->window).dictLimit = 1;
    (ms->window).lowLimit = 1;
    (ms->window).nextSrc = (BYTE *)"PK\x06\x06";
    (ms->window).nbOverflowCorrections = 0;
    ws->tableValidEnd = ws->objectEnd;
  }
  ms->hashLog3 = uVar8;
  UVar15 = *(int *)&(ms->window).nextSrc - *(int *)&(ms->window).base;
  (ms->window).lowLimit = UVar15;
  (ms->window).dictLimit = UVar15;
  ms->nextToUpdate = UVar15;
  ms->loadedDictEnd = 0;
  (ms->opt).litLengthSum = 0;
  ms->dictMatchState = (ZSTD_matchState_t *)0x0;
  bVar14 = (byte)uVar1;
  pvVar18 = ws->objectEnd;
  ws->tableEnd = pvVar18;
  if (ws->phase < ZSTD_cwksp_alloc_aligned) {
    if (ws->phase == ZSTD_cwksp_alloc_objects) {
      ws->tableValidEnd = pvVar18;
    }
    pvVar17 = (void *)(((ulong)(uint)-(int)ws->allocStart | 0xffffffffffffffc0) +
                      (long)ws->allocStart);
    if (pvVar17 < pvVar18) {
      ws->allocFailed = '\x01';
    }
    else {
      if (pvVar17 < ws->tableValidEnd) {
        ws->tableValidEnd = pvVar17;
      }
      ws->allocStart = pvVar17;
    }
    if ((pvVar18 <= pvVar17) &&
       (pvVar18 = (void *)((ulong)(-(int)pvVar18 & 0x3f) + (long)pvVar18),
       pvVar18 <= ws->workspaceEnd)) {
      ws->objectEnd = pvVar18;
      ws->tableEnd = pvVar18;
      ws->tableValidEnd = pvVar18;
      ws->phase = ZSTD_cwksp_alloc_aligned;
      goto LAB_00631135;
    }
LAB_00631146:
    pUVar9 = (U32 *)0x0;
  }
  else {
LAB_00631135:
    pUVar9 = (U32 *)ws->tableEnd;
    pvVar18 = (void *)((4L << (bVar14 & 0x3f)) + (long)pUVar9);
    if (ws->allocStart < pvVar18) {
      ws->allocFailed = '\x01';
      goto LAB_00631146;
    }
    ws->tableEnd = pvVar18;
  }
  ms->hashTable = pUVar9;
  if (ws->phase < ZSTD_cwksp_alloc_aligned) {
    if (ws->phase == ZSTD_cwksp_alloc_objects) {
      ws->tableValidEnd = ws->objectEnd;
    }
    pvVar18 = (void *)(((ulong)(uint)-(int)ws->allocStart | 0xffffffffffffffc0) +
                      (long)ws->allocStart);
    if (pvVar18 < ws->tableEnd) {
      ws->allocFailed = '\x01';
    }
    else {
      if (pvVar18 < ws->tableValidEnd) {
        ws->tableValidEnd = pvVar18;
      }
      ws->allocStart = pvVar18;
    }
    if ((ws->tableEnd <= pvVar18) &&
       (pvVar18 = (void *)((ulong)(-(int)ws->objectEnd & 0x3f) + (long)ws->objectEnd),
       pvVar18 <= ws->workspaceEnd)) {
      ws->objectEnd = pvVar18;
      ws->tableEnd = pvVar18;
      ws->tableValidEnd = pvVar18;
      ws->phase = ZSTD_cwksp_alloc_aligned;
      goto LAB_006311bf;
    }
LAB_006311d0:
    pUVar9 = (U32 *)0x0;
  }
  else {
LAB_006311bf:
    pUVar9 = (U32 *)ws->tableEnd;
    if (ws->allocStart < (void *)(lVar16 + (long)pUVar9)) {
      ws->allocFailed = '\x01';
      goto LAB_006311d0;
    }
    ws->tableEnd = (void *)(lVar16 + (long)pUVar9);
  }
  ms->chainTable = pUVar9;
  lVar16 = 4L << ((byte)uVar8 & 0x3f);
  if (uVar8 == 0) {
    lVar16 = 0;
  }
  if (ws->phase < ZSTD_cwksp_alloc_aligned) {
    if (ws->phase == ZSTD_cwksp_alloc_objects) {
      ws->tableValidEnd = ws->objectEnd;
    }
    pvVar18 = (void *)(((ulong)(uint)-(int)ws->allocStart | 0xffffffffffffffc0) +
                      (long)ws->allocStart);
    if (pvVar18 < ws->tableEnd) {
      ws->allocFailed = '\x01';
    }
    else {
      if (pvVar18 < ws->tableValidEnd) {
        ws->tableValidEnd = pvVar18;
      }
      ws->allocStart = pvVar18;
    }
    if ((ws->tableEnd <= pvVar18) &&
       (pvVar18 = (void *)((ulong)(-(int)ws->objectEnd & 0x3f) + (long)ws->objectEnd),
       pvVar18 <= ws->workspaceEnd)) {
      ws->objectEnd = pvVar18;
      ws->tableEnd = pvVar18;
      ws->tableValidEnd = pvVar18;
      ws->phase = ZSTD_cwksp_alloc_aligned;
      goto LAB_00631250;
    }
LAB_00631261:
    pUVar9 = (U32 *)0x0;
  }
  else {
LAB_00631250:
    pUVar9 = (U32 *)ws->tableEnd;
    if (ws->allocStart < (void *)(lVar16 + (long)pUVar9)) {
      ws->allocFailed = '\x01';
      goto LAB_00631261;
    }
    ws->tableEnd = (void *)(lVar16 + (long)pUVar9);
  }
  ms->hashTable3 = pUVar9;
  if (ws->allocFailed != '\0') {
    return 0xffffffffffffffc0;
  }
  if (crp != ZSTDcrp_leaveDirty) {
    pvVar18 = ws->tableValidEnd;
    if (pvVar18 < ws->tableEnd) {
      memset(pvVar18,0,(long)ws->tableEnd - (long)pvVar18);
    }
    if (ws->tableValidEnd < ws->tableEnd) {
      ws->tableValidEnd = ws->tableEnd;
    }
  }
  if ((forWho == ZSTD_resetTarget_CCtx) && (ZSTD_btlazy2 < cParams->strategy)) {
    if (ws->phase < ZSTD_cwksp_alloc_aligned) {
      if (ws->phase == ZSTD_cwksp_alloc_objects) {
        ws->tableValidEnd = ws->objectEnd;
      }
      pvVar18 = (void *)(((ulong)(uint)-(int)ws->allocStart | 0xffffffffffffffc0) +
                        (long)ws->allocStart);
      if (pvVar18 < ws->tableEnd) {
        ws->allocFailed = '\x01';
      }
      else {
        if (pvVar18 < ws->tableValidEnd) {
          ws->tableValidEnd = pvVar18;
        }
        ws->allocStart = pvVar18;
      }
      if ((ws->tableEnd <= pvVar18) &&
         (pvVar18 = (void *)((ulong)(-(int)ws->objectEnd & 0x3f) + (long)ws->objectEnd),
         pvVar18 <= ws->workspaceEnd)) {
        ws->objectEnd = pvVar18;
        ws->tableEnd = pvVar18;
        ws->tableValidEnd = pvVar18;
        ws->phase = ZSTD_cwksp_alloc_aligned;
        goto LAB_0063132a;
      }
LAB_0063133f:
      puVar10 = (uint *)0x0;
    }
    else {
LAB_0063132a:
      puVar10 = (uint *)((long)ws->allocStart - 0x400);
      if (puVar10 < ws->tableEnd) {
        ws->allocFailed = '\x01';
        goto LAB_0063133f;
      }
      if (puVar10 < ws->tableValidEnd) {
        ws->tableValidEnd = puVar10;
      }
      ws->allocStart = puVar10;
    }
    (ms->opt).litFreq = puVar10;
    if (ws->phase < ZSTD_cwksp_alloc_aligned) {
      if (ws->phase == ZSTD_cwksp_alloc_objects) {
        ws->tableValidEnd = ws->objectEnd;
      }
      pvVar18 = (void *)(((ulong)(uint)-(int)ws->allocStart | 0xffffffffffffffc0) +
                        (long)ws->allocStart);
      if (pvVar18 < ws->tableEnd) {
        ws->allocFailed = '\x01';
      }
      else {
        if (pvVar18 < ws->tableValidEnd) {
          ws->tableValidEnd = pvVar18;
        }
        ws->allocStart = pvVar18;
      }
      if ((ws->tableEnd <= pvVar18) &&
         (pvVar18 = (void *)((ulong)(-(int)ws->objectEnd & 0x3f) + (long)ws->objectEnd),
         pvVar18 <= ws->workspaceEnd)) {
        ws->objectEnd = pvVar18;
        ws->tableEnd = pvVar18;
        ws->tableValidEnd = pvVar18;
        ws->phase = ZSTD_cwksp_alloc_aligned;
        goto LAB_006313c4;
      }
LAB_006313d9:
      puVar10 = (uint *)0x0;
    }
    else {
LAB_006313c4:
      puVar10 = (uint *)((long)ws->allocStart - 0xc0);
      if (puVar10 < ws->tableEnd) {
        ws->allocFailed = '\x01';
        goto LAB_006313d9;
      }
      if (puVar10 < ws->tableValidEnd) {
        ws->tableValidEnd = puVar10;
      }
      ws->allocStart = puVar10;
    }
    (ms->opt).litLengthFreq = puVar10;
    if (ws->phase < ZSTD_cwksp_alloc_aligned) {
      if (ws->phase == ZSTD_cwksp_alloc_objects) {
        ws->tableValidEnd = ws->objectEnd;
      }
      pvVar18 = (void *)(((ulong)(uint)-(int)ws->allocStart | 0xffffffffffffffc0) +
                        (long)ws->allocStart);
      if (pvVar18 < ws->tableEnd) {
        ws->allocFailed = '\x01';
      }
      else {
        if (pvVar18 < ws->tableValidEnd) {
          ws->tableValidEnd = pvVar18;
        }
        ws->allocStart = pvVar18;
      }
      if ((ws->tableEnd <= pvVar18) &&
         (pvVar18 = (void *)((ulong)(-(int)ws->objectEnd & 0x3f) + (long)ws->objectEnd),
         pvVar18 <= ws->workspaceEnd)) {
        ws->objectEnd = pvVar18;
        ws->tableEnd = pvVar18;
        ws->tableValidEnd = pvVar18;
        ws->phase = ZSTD_cwksp_alloc_aligned;
        goto LAB_0063145e;
      }
LAB_00631473:
      puVar10 = (uint *)0x0;
    }
    else {
LAB_0063145e:
      puVar10 = (uint *)((long)ws->allocStart - 0x100);
      if (puVar10 < ws->tableEnd) {
        ws->allocFailed = '\x01';
        goto LAB_00631473;
      }
      if (puVar10 < ws->tableValidEnd) {
        ws->tableValidEnd = puVar10;
      }
      ws->allocStart = puVar10;
    }
    (ms->opt).matchLengthFreq = puVar10;
    if (ws->phase < ZSTD_cwksp_alloc_aligned) {
      if (ws->phase == ZSTD_cwksp_alloc_objects) {
        ws->tableValidEnd = ws->objectEnd;
      }
      pvVar18 = (void *)(((ulong)(uint)-(int)ws->allocStart | 0xffffffffffffffc0) +
                        (long)ws->allocStart);
      if (pvVar18 < ws->tableEnd) {
        ws->allocFailed = '\x01';
      }
      else {
        if (pvVar18 < ws->tableValidEnd) {
          ws->tableValidEnd = pvVar18;
        }
        ws->allocStart = pvVar18;
      }
      if ((ws->tableEnd <= pvVar18) &&
         (pvVar18 = (void *)((ulong)(-(int)ws->objectEnd & 0x3f) + (long)ws->objectEnd),
         pvVar18 <= ws->workspaceEnd)) {
        ws->objectEnd = pvVar18;
        ws->tableEnd = pvVar18;
        ws->tableValidEnd = pvVar18;
        ws->phase = ZSTD_cwksp_alloc_aligned;
        goto LAB_006314f8;
      }
LAB_0063150a:
      puVar10 = (uint *)0x0;
    }
    else {
LAB_006314f8:
      puVar10 = (uint *)((long)ws->allocStart - 0x80);
      if (puVar10 < ws->tableEnd) {
        ws->allocFailed = '\x01';
        goto LAB_0063150a;
      }
      if (puVar10 < ws->tableValidEnd) {
        ws->tableValidEnd = puVar10;
      }
      ws->allocStart = puVar10;
    }
    (ms->opt).offCodeFreq = puVar10;
    if (ws->phase < ZSTD_cwksp_alloc_aligned) {
      if (ws->phase == ZSTD_cwksp_alloc_objects) {
        ws->tableValidEnd = ws->objectEnd;
      }
      pvVar18 = (void *)(((ulong)(uint)-(int)ws->allocStart | 0xffffffffffffffc0) +
                        (long)ws->allocStart);
      if (pvVar18 < ws->tableEnd) {
        ws->allocFailed = '\x01';
      }
      else {
        if (pvVar18 < ws->tableValidEnd) {
          ws->tableValidEnd = pvVar18;
        }
        ws->allocStart = pvVar18;
      }
      if ((ws->tableEnd <= pvVar18) &&
         (pvVar18 = (void *)((ulong)(-(int)ws->objectEnd & 0x3f) + (long)ws->objectEnd),
         pvVar18 <= ws->workspaceEnd)) {
        ws->objectEnd = pvVar18;
        ws->tableEnd = pvVar18;
        ws->tableValidEnd = pvVar18;
        ws->phase = ZSTD_cwksp_alloc_aligned;
        goto LAB_0063158f;
      }
LAB_006315a4:
      pZVar11 = (ZSTD_match_t *)0x0;
    }
    else {
LAB_0063158f:
      pZVar11 = (ZSTD_match_t *)((long)ws->allocStart - 0x8040);
      if (pZVar11 < (ZSTD_match_t *)ws->tableEnd) {
        ws->allocFailed = '\x01';
        goto LAB_006315a4;
      }
      if (pZVar11 < (ZSTD_match_t *)ws->tableValidEnd) {
        ws->tableValidEnd = pZVar11;
      }
      ws->allocStart = pZVar11;
    }
    (ms->opt).matchTable = pZVar11;
    if (ws->phase < ZSTD_cwksp_alloc_aligned) {
      if (ws->phase == ZSTD_cwksp_alloc_objects) {
        ws->tableValidEnd = ws->objectEnd;
      }
      pvVar18 = (void *)(((ulong)(uint)-(int)ws->allocStart | 0xffffffffffffffc0) +
                        (long)ws->allocStart);
      if (pvVar18 < ws->tableEnd) {
        ws->allocFailed = '\x01';
      }
      else {
        if (pvVar18 < ws->tableValidEnd) {
          ws->tableValidEnd = pvVar18;
        }
        ws->allocStart = pvVar18;
      }
      if ((ws->tableEnd <= pvVar18) &&
         (pvVar18 = (void *)((ulong)(-(int)ws->objectEnd & 0x3f) + (long)ws->objectEnd),
         pvVar18 <= ws->workspaceEnd)) {
        ws->objectEnd = pvVar18;
        ws->tableEnd = pvVar18;
        ws->tableValidEnd = pvVar18;
        ws->phase = ZSTD_cwksp_alloc_aligned;
        goto LAB_00631629;
      }
LAB_0063163e:
      pZVar12 = (ZSTD_optimal_t *)0x0;
    }
    else {
LAB_00631629:
      pZVar12 = (ZSTD_optimal_t *)((long)ws->allocStart - 0x1c040);
      if (pZVar12 < (ZSTD_optimal_t *)ws->tableEnd) {
        ws->allocFailed = '\x01';
        goto LAB_0063163e;
      }
      if (pZVar12 < (ZSTD_optimal_t *)ws->tableValidEnd) {
        ws->tableValidEnd = pZVar12;
      }
      ws->allocStart = pZVar12;
    }
    (ms->opt).priceTable = pZVar12;
  }
  if ((useRowMatchFinder != ZSTD_urm_enableRowMatchFinder) ||
     (cParams->strategy - ZSTD_btlazy2 < 0xfffffffd)) goto LAB_00631742;
  __n = 2L << (bVar14 & 0x3f);
  uVar13 = __n + 0x3f & 0xffffffffffffffc0;
  if (ws->phase < ZSTD_cwksp_alloc_aligned) {
    if (ws->phase == ZSTD_cwksp_alloc_objects) {
      ws->tableValidEnd = ws->objectEnd;
    }
    pvVar18 = (void *)(((ulong)(uint)-(int)ws->allocStart | 0xffffffffffffffc0) +
                      (long)ws->allocStart);
    if (pvVar18 < ws->tableEnd) {
      ws->allocFailed = '\x01';
    }
    else {
      if (pvVar18 < ws->tableValidEnd) {
        ws->tableValidEnd = pvVar18;
      }
      ws->allocStart = pvVar18;
    }
    bVar2 = true;
    if ((ws->tableEnd <= pvVar18) &&
       (pvVar18 = (void *)((ulong)(-(int)ws->objectEnd & 0x3f) + (long)ws->objectEnd),
       pvVar18 <= ws->workspaceEnd)) {
      ws->objectEnd = pvVar18;
      ws->tableEnd = pvVar18;
      ws->tableValidEnd = pvVar18;
      ws->phase = ZSTD_cwksp_alloc_aligned;
      goto LAB_006316f1;
    }
  }
  else {
LAB_006316f1:
    bVar2 = false;
  }
  if (uVar13 == 0 || bVar2) {
LAB_00631710:
    __s = (U16 *)0x0;
  }
  else {
    __s = (U16 *)((long)ws->allocStart - uVar13);
    if (__s < ws->tableEnd) {
      ws->allocFailed = '\x01';
      goto LAB_00631710;
    }
    if (__s < ws->tableValidEnd) {
      ws->tableValidEnd = __s;
    }
    ws->allocStart = __s;
  }
  ms->tagTable = __s;
  if (__s != (U16 *)0x0) {
    memset(__s,0,__n);
  }
  ms->rowHashLog = (cParams->hashLog - 5) + (uint)(cParams->searchLog < 5);
LAB_00631742:
  uVar4 = cParams->windowLog;
  uVar5 = cParams->chainLog;
  uVar6 = cParams->hashLog;
  uVar7 = cParams->searchLog;
  uVar1 = cParams->minMatch;
  uVar8 = cParams->targetLength;
  ZVar3 = cParams->strategy;
  (ms->cParams).searchLog = cParams->searchLog;
  (ms->cParams).minMatch = uVar1;
  (ms->cParams).targetLength = uVar8;
  (ms->cParams).strategy = ZVar3;
  (ms->cParams).windowLog = uVar4;
  (ms->cParams).chainLog = uVar5;
  (ms->cParams).hashLog = uVar6;
  (ms->cParams).searchLog = uVar7;
  return (ulong)(ws->allocFailed == '\0') * 0x40 - 0x40;
}

Assistant:

static size_t
ZSTD_reset_matchState(ZSTD_matchState_t* ms,
                      ZSTD_cwksp* ws,
                const ZSTD_compressionParameters* cParams,
                const ZSTD_useRowMatchFinderMode_e useRowMatchFinder,
                const ZSTD_compResetPolicy_e crp,
                const ZSTD_indexResetPolicy_e forceResetIndex,
                const ZSTD_resetTarget_e forWho)
{
    /* disable chain table allocation for fast or row-based strategies */
    size_t const chainSize = ZSTD_allocateChainTable(cParams->strategy, useRowMatchFinder,
                                                     ms->dedicatedDictSearch && (forWho == ZSTD_resetTarget_CDict))
                                ? ((size_t)1 << cParams->chainLog)
                                : 0;
    size_t const hSize = ((size_t)1) << cParams->hashLog;
    U32    const hashLog3 = ((forWho == ZSTD_resetTarget_CCtx) && cParams->minMatch==3) ? MIN(ZSTD_HASHLOG3_MAX, cParams->windowLog) : 0;
    size_t const h3Size = hashLog3 ? ((size_t)1) << hashLog3 : 0;

    DEBUGLOG(4, "reset indices : %u", forceResetIndex == ZSTDirp_reset);
    assert(useRowMatchFinder != ZSTD_urm_auto);
    if (forceResetIndex == ZSTDirp_reset) {
        ZSTD_window_init(&ms->window);
        ZSTD_cwksp_mark_tables_dirty(ws);
    }

    ms->hashLog3 = hashLog3;

    ZSTD_invalidateMatchState(ms);

    assert(!ZSTD_cwksp_reserve_failed(ws)); /* check that allocation hasn't already failed */

    ZSTD_cwksp_clear_tables(ws);

    DEBUGLOG(5, "reserving table space");
    /* table Space */
    ms->hashTable = (U32*)ZSTD_cwksp_reserve_table(ws, hSize * sizeof(U32));
    ms->chainTable = (U32*)ZSTD_cwksp_reserve_table(ws, chainSize * sizeof(U32));
    ms->hashTable3 = (U32*)ZSTD_cwksp_reserve_table(ws, h3Size * sizeof(U32));
    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");

    DEBUGLOG(4, "reset table : %u", crp!=ZSTDcrp_leaveDirty);
    if (crp!=ZSTDcrp_leaveDirty) {
        /* reset tables only */
        ZSTD_cwksp_clean_tables(ws);
    }

    /* opt parser space */
    if ((forWho == ZSTD_resetTarget_CCtx) && (cParams->strategy >= ZSTD_btopt)) {
        DEBUGLOG(4, "reserving optimal parser space");
        ms->opt.litFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (1<<Litbits) * sizeof(unsigned));
        ms->opt.litLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxLL+1) * sizeof(unsigned));
        ms->opt.matchLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxML+1) * sizeof(unsigned));
        ms->opt.offCodeFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxOff+1) * sizeof(unsigned));
        ms->opt.matchTable = (ZSTD_match_t*)ZSTD_cwksp_reserve_aligned(ws, (ZSTD_OPT_NUM+1) * sizeof(ZSTD_match_t));
        ms->opt.priceTable = (ZSTD_optimal_t*)ZSTD_cwksp_reserve_aligned(ws, (ZSTD_OPT_NUM+1) * sizeof(ZSTD_optimal_t));
    }

    if (ZSTD_rowMatchFinderUsed(cParams->strategy, useRowMatchFinder)) {
        {   /* Row match finder needs an additional table of hashes ("tags") */
            size_t const tagTableSize = hSize*sizeof(U16);
            ms->tagTable = (U16*)ZSTD_cwksp_reserve_aligned(ws, tagTableSize);
            if (ms->tagTable) ZSTD_memset(ms->tagTable, 0, tagTableSize);
        }
        {   /* Switch to 32-entry rows if searchLog is 5 (or more) */
            U32 const rowLog = cParams->searchLog < 5 ? 4 : 5;
            assert(cParams->hashLog > rowLog);
            ms->rowHashLog = cParams->hashLog - rowLog;
        }
    }

    ms->cParams = *cParams;

    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");
    return 0;
}